

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

int __thiscall
google::protobuf::RepeatedField<double>::SpaceUsedExcludingSelf(RepeatedField<double> *this)

{
  LogMessage *other;
  ulong uVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = 0;
  if (0 < (long)this->total_size_) {
    uVar1 = (long)this->total_size_ * 8 + 8;
  }
  if ((int)(uVar1 >> 0x1f) != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.h"
               ,0x80);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (size) <= (static_cast<size_t>(2147483647)): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (int)uVar1;
}

Assistant:

inline size_t RepeatedField<Element>::SpaceUsedExcludingSelfLong() const {
  return total_size_ > 0 ? (total_size_ * sizeof(Element) + kRepHeaderSize) : 0;
}